

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O1

BasicHandleInfo * __thiscall
helics::HandleManager::getInterfaceHandle(HandleManager *this,string_view name,InterfaceType type)

{
  const_iterator cVar1;
  reference pBVar2;
  int iVar3;
  undefined7 in_register_00000009;
  long lVar4;
  bool bVar5;
  key_type local_20;
  
  local_20._M_str = name._M_str;
  local_20._M_len = name._M_len;
  iVar3 = (int)CONCAT71(in_register_00000009,type);
  if (iVar3 == 0x66) {
    lVar4 = 0xf8;
  }
  else if (iVar3 == 0x69) {
    lVar4 = 0xc0;
  }
  else {
    lVar4 = 0x88;
    if (iVar3 == 0x70) {
      lVar4 = 0x50;
    }
  }
  cVar1 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((long)&(this->handles).
                            super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                            ._M_impl.super__Deque_impl_data._M_map + lVar4),&local_20);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
      ._M_cur == (__node_type *)0x0) {
    pBVar2 = (BasicHandleInfo *)0x0;
  }
  else {
    pBVar2 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](&(this->handles).
                           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                           ._M_impl.super__Deque_impl_data._M_start,
                          (long)*(int *)((long)cVar1.
                                               super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                                               ._M_cur + 0x18));
    if (type == SINK) {
      bVar5 = pBVar2->handleType == SINK;
    }
    else {
      if (type != TRANSLATOR) {
        return pBVar2;
      }
      bVar5 = pBVar2->handleType == TRANSLATOR;
    }
    if (!bVar5) {
      pBVar2 = (BasicHandleInfo *)0x0;
    }
  }
  return pBVar2;
}

Assistant:

const BasicHandleInfo* HandleManager::getInterfaceHandle(std::string_view name,
                                                         InterfaceType type) const
{
    const auto& imap = getMap(type);
    const BasicHandleInfo* handle{nullptr};
    auto fnd = imap.find(name);
    if (fnd != imap.end()) {
        handle = &handles[fnd->second.baseValue()];
        if (type == InterfaceType::TRANSLATOR) {
            if (handle->handleType != InterfaceType::TRANSLATOR) {
                handle = nullptr;
            }
        } else if (type == InterfaceType::SINK) {
            if (handle->handleType != InterfaceType::SINK) {
                handle = nullptr;
            }
        }
    }
    return handle;
}